

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memdbFileControl(sqlite3_file *pFile,int op,void *pArg)

{
  long *plVar1;
  char *pcVar2;
  long *in_RDX;
  int in_ESI;
  long in_RDI;
  sqlite3_int64 iLimit;
  int rc;
  MemStore *p;
  long local_30;
  int local_24;
  
  plVar1 = *(long **)(in_RDI + 8);
  local_24 = 0xc;
  memdbEnter((MemStore *)0x1582f6);
  if (in_ESI == 0xc) {
    pcVar2 = sqlite3_mprintf("memdb(%p,%lld)",plVar1[3],*plVar1);
    *in_RDX = (long)pcVar2;
    local_24 = 0;
  }
  if (in_ESI == 0x24) {
    local_30 = *in_RDX;
    if (local_30 < *plVar1) {
      if (local_30 < 0) {
        local_30 = plVar1[2];
      }
      else {
        local_30 = *plVar1;
      }
    }
    plVar1[2] = local_30;
    *in_RDX = local_30;
    local_24 = 0;
  }
  memdbLeave((MemStore *)0x1583a6);
  return local_24;
}

Assistant:

static int memdbFileControl(sqlite3_file *pFile, int op, void *pArg){
  MemStore *p = ((MemFile*)pFile)->pStore;
  int rc = SQLITE_NOTFOUND;
  memdbEnter(p);
  if( op==SQLITE_FCNTL_VFSNAME ){
    *(char**)pArg = sqlite3_mprintf("memdb(%p,%lld)", p->aData, p->sz);
    rc = SQLITE_OK;
  }
  if( op==SQLITE_FCNTL_SIZE_LIMIT ){
    sqlite3_int64 iLimit = *(sqlite3_int64*)pArg;
    if( iLimit<p->sz ){
      if( iLimit<0 ){
        iLimit = p->szMax;
      }else{
        iLimit = p->sz;
      }
    }
    p->szMax = iLimit;
    *(sqlite3_int64*)pArg = iLimit;
    rc = SQLITE_OK;
  }
  memdbLeave(p);
  return rc;
}